

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteVmLoadCollection(unqlite_vm *pVm,char *zName,sxu32 nByte,int iFlag,unqlite_col **ppOut)

{
  unqlite *pDb_00;
  int iVar1;
  unqlite_col *pCol_00;
  unqlite_col_record **ppuVar2;
  char *local_68;
  char *zDup;
  int rc;
  unqlite_col *pCol;
  unqlite *pDb;
  unqlite_kv_cursor *pCursor;
  unqlite_kv_engine *pEngine;
  unqlite_kv_methods *pMethods;
  unqlite_col **ppOut_local;
  int iFlag_local;
  sxu32 nByte_local;
  char *zName_local;
  unqlite_vm *pVm_local;
  
  pDb_00 = pVm->pDb;
  local_68 = (char *)0x0;
  pMethods = (unqlite_kv_methods *)ppOut;
  ppOut_local._0_4_ = iFlag;
  ppOut_local._4_4_ = nByte;
  _iFlag_local = zName;
  zName_local = (char *)pVm;
  pCursor = (unqlite_kv_cursor *)unqlitePagerGetKvEngine(pVm->pDb);
  pEngine = (unqlite_kv_engine *)((unqlite_kv_engine *)pCursor)->pIo->pMethods;
  iVar1 = unqliteInitCursor(pDb_00,(unqlite_kv_cursor **)&pDb);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (((uint)ppOut_local & 1) == 0) {
    iVar1 = (*(code *)pEngine[10].pIo)(pDb,_iFlag_local,ppOut_local._4_4_,1);
    if ((iVar1 != 0) && (((uint)ppOut_local & 2) == 0)) {
      unqliteGenErrorFormat
                (pDb_00,"Collection \'%.*s\' not defined in the underlying database",
                 (ulong)ppOut_local._4_4_,_iFlag_local);
      unqliteReleaseCursor(pDb_00,(unqlite_kv_cursor *)pDb);
      return iVar1;
    }
    if (((uint)ppOut_local & 2) != 0) {
      unqliteReleaseCursor(pDb_00,(unqlite_kv_cursor *)pDb);
      return iVar1;
    }
  }
  pCol_00 = (unqlite_col *)SyMemBackendPoolAlloc((SyMemBackend *)(zName_local + 8),0x140);
  if (pCol_00 == (unqlite_col *)0x0) {
    unqliteGenOutofMem(pDb_00);
    zDup._4_4_ = -1;
  }
  else {
    SyZero(pCol_00,0x140);
    SyBlobInit(&pCol_00->sWorker,(SyMemBackend *)(zName_local + 8));
    SyBlobInit(&pCol_00->sHeader,(SyMemBackend *)(zName_local + 8));
    pCol_00->pVm = (unqlite_vm *)zName_local;
    pCol_00->pCursor = (unqlite_kv_cursor *)pDb;
    local_68 = SyMemBackendStrDup((SyMemBackend *)(zName_local + 8),_iFlag_local,ppOut_local._4_4_);
    if (local_68 == (char *)0x0) {
      unqliteGenOutofMem(pDb_00);
      zDup._4_4_ = -1;
    }
    else {
      pCol_00->nRecSize = 0x40;
      ppuVar2 = (unqlite_col_record **)
                SyMemBackendAlloc((SyMemBackend *)(zName_local + 8),pCol_00->nRecSize << 3);
      pCol_00->apRecord = ppuVar2;
      if (pCol_00->apRecord == (unqlite_col_record **)0x0) {
        unqliteGenOutofMem(pDb_00);
        zDup._4_4_ = -1;
      }
      else {
        SyZero(pCol_00->apRecord,pCol_00->nRecSize << 3);
        (pCol_00->sName).zString = local_68;
        (pCol_00->sName).nByte = ppOut_local._4_4_;
        jx9MemObjInit(*(jx9_vm **)(zName_local + 0xd8),&pCol_00->sSchema);
        if (((uint)ppOut_local & 1) == 0) {
          zDup._4_4_ = CollectionLoadHeader(pCol_00);
          if (zDup._4_4_ == 0) {
LAB_001231be:
            unqliteVmInstallCollection((unqlite_vm *)zName_local,pCol_00);
            if (pMethods != (unqlite_kv_methods *)0x0) {
              pMethods->zName = (char *)pCol_00;
            }
            return 0;
          }
          unqliteGenErrorFormat(pDb_00,"Corrupt collection \'%z\' header",&pCol_00->sName);
        }
        else if (pEngine[7].pIo == (unqlite_kv_io *)0x0) {
          unqliteGenErrorFormat
                    (pDb_00,
                     "Cannot create new collection \'%z\' due to a read-only Key/Value storage engine"
                     ,&pCol_00->sName);
          zDup._4_4_ = -10;
        }
        else {
          iVar1 = CollectionSetHeader((unqlite_kv_engine *)pCursor,pCol_00,0,0,(jx9_value *)0x0);
          if (iVar1 == 0) goto LAB_001231be;
          zDup._4_4_ = -10;
        }
      }
    }
  }
  unqliteReleaseCursor(pDb_00,(unqlite_kv_cursor *)pDb);
  if (local_68 != (char *)0x0) {
    SyMemBackendFree((SyMemBackend *)(zName_local + 8),local_68);
  }
  if (pCol_00 != (unqlite_col *)0x0) {
    if (pCol_00->apRecord != (unqlite_col_record **)0x0) {
      SyMemBackendFree((SyMemBackend *)(zName_local + 8),pCol_00->apRecord);
    }
    SyBlobRelease(&pCol_00->sHeader);
    SyBlobRelease(&pCol_00->sWorker);
    jx9MemObjRelease(&pCol_00->sSchema);
    SyMemBackendPoolFree((SyMemBackend *)(zName_local + 8),pCol_00);
  }
  return zDup._4_4_;
}

Assistant:

static int unqliteVmLoadCollection(
	unqlite_vm *pVm,    /* Target VM */
	const char *zName,  /* Collection name */
	sxu32 nByte,        /* zName length */
	int iFlag,          /* Control flag */
	unqlite_col **ppOut /* OUT: in-memory collection */
	)
{
	unqlite_kv_methods *pMethods;
	unqlite_kv_engine *pEngine;
	unqlite_kv_cursor *pCursor;
	unqlite *pDb = pVm->pDb;
	unqlite_col *pCol = 0; /* cc warning */
	int rc = SXERR_MEM;
	char *zDup = 0;
	/* Point to the underlying KV store */
	pEngine = unqlitePagerGetKvEngine(pVm->pDb);
	pMethods = pEngine->pIo->pMethods;
	/* Allocate a new cursor */
	rc = unqliteInitCursor(pDb,&pCursor);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	if( (iFlag & UNQLITE_VM_COLLECTION_CREATE) == 0 ){
		/* Seek to the desired location */
		rc = pMethods->xSeek(pCursor,(const void *)zName,(int)nByte,UNQLITE_CURSOR_MATCH_EXACT);
		if( rc != UNQLITE_OK && (iFlag & UNQLITE_VM_COLLECTION_EXISTS) == 0){
			unqliteGenErrorFormat(pDb,"Collection '%.*s' not defined in the underlying database",nByte,zName);

			unqliteReleaseCursor(pDb,pCursor);
			return rc;
		}
		else if((iFlag & UNQLITE_VM_COLLECTION_EXISTS)){
			unqliteReleaseCursor(pDb,pCursor);
			return rc;
		}
	}
	/* Allocate a new instance */
	pCol = (unqlite_col *)SyMemBackendPoolAlloc(&pVm->sAlloc,sizeof(unqlite_col));
	if( pCol == 0 ){
		unqliteGenOutofMem(pDb);
		rc = UNQLITE_NOMEM;
		goto fail;
	}
	SyZero(pCol,sizeof(unqlite_col));
	/* Fill in the structure */
	SyBlobInit(&pCol->sWorker,&pVm->sAlloc);
	SyBlobInit(&pCol->sHeader,&pVm->sAlloc);
	pCol->pVm = pVm;
	pCol->pCursor = pCursor;
	/* Duplicate collection name */
	zDup = SyMemBackendStrDup(&pVm->sAlloc,zName,nByte);
	if( zDup == 0 ){
		unqliteGenOutofMem(pDb);
		rc = UNQLITE_NOMEM;
		goto fail;
	}
	pCol->nRecSize = 64; /* Must be a power of two */
	pCol->apRecord = (unqlite_col_record **)SyMemBackendAlloc(&pVm->sAlloc,pCol->nRecSize * sizeof(unqlite_col_record *));
	if( pCol->apRecord == 0 ){
		unqliteGenOutofMem(pDb);
		rc = UNQLITE_NOMEM;
		goto fail;
	}
	/* Zero the table */
	SyZero((void *)pCol->apRecord,pCol->nRecSize * sizeof(unqlite_col_record *));
	SyStringInitFromBuf(&pCol->sName,zDup,nByte);
	jx9MemObjInit(pVm->pJx9Vm,&pCol->sSchema);
	if( iFlag & UNQLITE_VM_COLLECTION_CREATE ){
		/* Create a new collection */
		if( pMethods->xReplace == 0 ){
			/* Read-only KV engine: Generate an error message and return */
			unqliteGenErrorFormat(pDb,
				"Cannot create new collection '%z' due to a read-only Key/Value storage engine",
				&pCol->sName
			);
			rc = UNQLITE_ABORT; /* Abort VM execution */
			goto fail;
		}
		/* Write the collection header */
		rc = CollectionSetHeader(pEngine,pCol,0,0,0);
		if( rc != UNQLITE_OK ){
			rc = UNQLITE_ABORT; /* Abort VM execution */
			goto fail;
		}
	}else{
		/* Read the collection header */
		rc = CollectionLoadHeader(pCol);
		if( rc != UNQLITE_OK ){
			unqliteGenErrorFormat(pDb,"Corrupt collection '%z' header",&pCol->sName);
			goto fail;
		}
	}
	/* Finally install the collection */
	unqliteVmInstallCollection(pVm,pCol);
	/* All done */
	if( ppOut ){
		*ppOut = pCol;
	}
	return UNQLITE_OK;
fail:
	unqliteReleaseCursor(pDb,pCursor);
	if( zDup ){
		SyMemBackendFree(&pVm->sAlloc,zDup);
	}
	if( pCol ){
		if( pCol->apRecord ){
			SyMemBackendFree(&pVm->sAlloc,(void *)pCol->apRecord);
		}
		SyBlobRelease(&pCol->sHeader);
		SyBlobRelease(&pCol->sWorker);
		jx9MemObjRelease(&pCol->sSchema);
		SyMemBackendPoolFree(&pVm->sAlloc,pCol);
	}
	return rc;
}